

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O2

Mvc_Cover_t * Mvc_CoverRemoveDontCareLits(Mvc_Cover_t *pCover)

{
  Mvc_Cover_t *pMVar1;
  Mvc_Cube_t *pCube;
  
  pMVar1 = Mvc_CoverDup(pCover);
  pCube = (Mvc_Cube_t *)&pMVar1->lCubes;
  while (pCube = pCube->pNext, pCube != (Mvc_Cube_t *)0x0) {
    Mvc_CubeBitRemoveDcs(pCube);
  }
  return pMVar1;
}

Assistant:

Mvc_Cover_t * Mvc_CoverRemoveDontCareLits( Mvc_Cover_t * pCover )
{
    Mvc_Cover_t * pCoverNew;
    Mvc_Cube_t * pCube;

    pCoverNew = Mvc_CoverDup( pCover );
    Mvc_CoverForEachCube( pCoverNew, pCube )
        Mvc_CubeBitRemoveDcs( pCube );
    return pCoverNew;
}